

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_test.cpp
# Opt level: O2

void __thiscall
Filtration_simplex_iterator_test::test_method(Filtration_simplex_iterator_test *this)

{
  uint uVar1;
  Filtration_simplex_range *__x;
  long lVar2;
  undefined8 *puVar3;
  Bitmap_cubical_complex *pBVar4;
  pointer puVar5;
  double dVar6;
  initializer_list<double> __l;
  initializer_list<unsigned_int> __l_00;
  undefined **local_1d8;
  undefined1 local_1d0;
  undefined8 *local_1c8;
  char **local_1c0;
  vector<double,_std::allocator<double>_> fil;
  vector<unsigned_int,_std::allocator<unsigned_int>_> dim;
  undefined1 local_180 [8];
  undefined8 local_178;
  shared_count sStack_170;
  char *local_168;
  char *local_160;
  Filtration_simplex_range range;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> dimensions;
  vector<double,_std::allocator<double>_> increasingFiltrationOfTopDimensionalCells;
  Bitmap_cubical_complex increasing;
  
  puVar3 = &DAT_00119e38;
  pBVar4 = &increasing;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pBVar4->super_Bitmap_cubical_complex_base<double>)._vptr_Bitmap_cubical_complex_base =
         (_func_int **)*puVar3;
    puVar3 = puVar3 + 1;
    pBVar4 = (Bitmap_cubical_complex *)&(pBVar4->super_Bitmap_cubical_complex_base<double>).sizes;
  }
  __l._M_len = 9;
  __l._M_array = (iterator)&increasing;
  std::vector<double,_std::allocator<double>_>::vector
            (&increasingFiltrationOfTopDimensionalCells,__l,(allocator_type *)&local_1d8);
  increasing.super_Bitmap_cubical_complex_base<double>._vptr_Bitmap_cubical_complex_base =
       (_func_int **)0x300000003;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&increasing;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&dimensions,__l_00,(allocator_type *)&local_1d8);
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
  Bitmap_cubical_complex(&increasing,&dimensions,&increasingFiltrationOfTopDimensionalCells,true);
  dim.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dim.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dim.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8._0_4_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  local_1d8 = (undefined **)CONCAT44(local_1d8._4_4_,2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&dim,(uint *)&local_1d8);
  fil.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fil.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  fil.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1d8 = (undefined **)0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4000000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4000000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4000000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4000000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4000000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4000000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4008000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4008000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4008000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4008000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4008000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4008000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4010000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4010000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4010000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4010000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4010000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4010000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4014000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4014000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4014000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4014000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4018000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4018000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4018000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4018000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x401c000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x401c000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x401c000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x401c000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x401c000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x401c000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4020000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4020000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4020000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4020000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4022000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4022000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4022000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  local_1d8 = (undefined **)0x4022000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&fil,(double *)&local_1d8);
  __x = Gudhi::cubical_complex::
        Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
        filtration_simplex_range(&increasing);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&range,__x);
  lVar2 = 0;
  for (puVar5 = range.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar5 != range.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
    ;
    local_e8 = "";
    local_100 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x1ac,&local_100);
    uVar1 = Gudhi::cubical_complex::
            Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
            dimension(&increasing,*puVar5);
    local_180[0] = uVar1 == *(uint *)((long)dim.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar2);
    local_178 = 0;
    sStack_170.pi_ = (sp_counted_base *)0x0;
    local_168 = "increasing.dimension(*it) == dim[position]";
    local_160 = "";
    local_1d0 = 0;
    local_1d8 = &PTR__lazy_ostream_00122ba8;
    local_1c8 = &boost::unit_test::lazy_ostream::inst;
    local_1c0 = &local_168;
    local_110 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
    ;
    local_108 = "";
    boost::test_tools::tt_detail::report_assertion(local_180,&local_1d8,&local_110,0x1ac,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_170);
    local_120 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
    ;
    local_118 = "";
    local_130 = &boost::unit_test::basic_cstring<char_const>::null;
    local_128 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x1ad,&local_130);
    dVar6 = INFINITY;
    if (*puVar5 != 0xffffffffffffffff) {
      dVar6 = increasing.super_Bitmap_cubical_complex_base<double>.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[*puVar5];
    }
    local_180[0] = dVar6 == *(double *)
                             ((long)fil.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar2 * 2);
    local_178 = 0;
    sStack_170.pi_ = (sp_counted_base *)0x0;
    local_168 = "increasing.filtration(*it) == fil[position]";
    local_160 = "";
    local_1d0 = 0;
    local_1d8 = &PTR__lazy_ostream_00122ba8;
    local_1c8 = &boost::unit_test::lazy_ostream::inst;
    local_1c0 = &local_168;
    local_140 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
    ;
    local_138 = "";
    boost::test_tools::tt_detail::report_assertion(local_180,&local_1d8,&local_140,0x1ad,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_170);
    lVar2 = lVar2 + 4;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&range.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&fil.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&dim.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
  ~Bitmap_cubical_complex(&increasing);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&dimensions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&increasingFiltrationOfTopDimensionalCells.
              super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(Filtration_simplex_iterator_test) {
  std::vector<double> increasingFiltrationOfTopDimensionalCells({1, 2, 3, 4, 5, 6, 7, 8, 9});

  std::vector<unsigned> dimensions({3, 3});

  Bitmap_cubical_complex increasing(dimensions, increasingFiltrationOfTopDimensionalCells);

  std::vector<unsigned> dim;
  dim.push_back(0);
  dim.push_back(0);
  dim.push_back(0);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);
  dim.push_back(0);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);
  dim.push_back(0);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);
  dim.push_back(0);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);
  dim.push_back(0);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);
  dim.push_back(0);
  dim.push_back(1);
  dim.push_back(1);
  dim.push_back(2);

  std::vector<double> fil;
  fil.push_back(1);
  fil.push_back(1);
  fil.push_back(1);
  fil.push_back(1);
  fil.push_back(1);
  fil.push_back(1);
  fil.push_back(1);
  fil.push_back(1);
  fil.push_back(1);
  fil.push_back(2);
  fil.push_back(2);
  fil.push_back(2);
  fil.push_back(2);
  fil.push_back(2);
  fil.push_back(2);
  fil.push_back(3);
  fil.push_back(3);
  fil.push_back(3);
  fil.push_back(3);
  fil.push_back(3);
  fil.push_back(3);
  fil.push_back(4);
  fil.push_back(4);
  fil.push_back(4);
  fil.push_back(4);
  fil.push_back(4);
  fil.push_back(4);
  fil.push_back(5);
  fil.push_back(5);
  fil.push_back(5);
  fil.push_back(5);
  fil.push_back(6);
  fil.push_back(6);
  fil.push_back(6);
  fil.push_back(6);
  fil.push_back(7);
  fil.push_back(7);
  fil.push_back(7);
  fil.push_back(7);
  fil.push_back(7);
  fil.push_back(7);
  fil.push_back(8);
  fil.push_back(8);
  fil.push_back(8);
  fil.push_back(8);
  fil.push_back(9);
  fil.push_back(9);
  fil.push_back(9);
  fil.push_back(9);

  Bitmap_cubical_complex::Filtration_simplex_range range = increasing.filtration_simplex_range();
  size_t position = 0;
  for (auto it = range.begin(); it != range.end(); ++it) {
    BOOST_CHECK(increasing.dimension(*it) == dim[position]);
    BOOST_CHECK(increasing.filtration(*it) == fil[position]);
    ++position;
  }
}